

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputLBase::Setup(BasicInputLBase *this)

{
  DVec4 *pDVar1;
  Vector<double,_4> local_38;
  int local_14;
  BasicInputLBase *pBStack_10;
  int i;
  BasicInputLBase *this_local;
  
  this->m_po = 0;
  pBStack_10 = this;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    tcu::Vector<double,_4>::Vector(&local_38,0.0);
    pDVar1 = this->expected_data + local_14;
    pDVar1->m_data[0] = local_38.m_data[0];
    pDVar1->m_data[1] = local_38.m_data[1];
    pDVar1->m_data[2] = local_38.m_data[2];
    pDVar1->m_data[3] = local_38.m_data[3];
  }
  this->instance_count = 1;
  this->base_instance = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i = 0; i < 32; ++i)
		{
			expected_data[i] = DVec4(0.0);
		}
		instance_count = 1;
		base_instance  = 0;
		return NO_ERROR;
	}